

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::bufferSubData
          (ReferenceContext *this,deUint32 target,deIntptr offset,deIntptr size,void *data)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  DataBuffer *pDVar4;
  pointer puVar5;
  
  bVar3 = isValidBufferTarget(target);
  if (bVar3) {
    if (-1 < (size | offset)) {
      pDVar4 = getBufferBinding(this,target);
      if (pDVar4 == (DataBuffer *)0x0) {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x502;
        return;
      }
      puVar1 = (pDVar4->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pDVar4->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((int)size + (int)offset <= (int)puVar2 - (int)puVar1) {
        puVar5 = (pointer)0x0;
        if (puVar1 != puVar2) {
          puVar5 = puVar1;
        }
        memcpy(puVar5 + offset,data,(long)(int)size);
        return;
      }
    }
    if (this->m_lastError == 0) {
      this->m_lastError = 0x501;
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::bufferSubData (deUint32 target, deIntptr offset, deIntptr size, const void* data)
{
	RC_IF_ERROR(!isValidBufferTarget(target), GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(offset < 0 || size < 0, GL_INVALID_VALUE, RC_RET_VOID);

	DataBuffer* buffer = getBufferBinding(target);

	RC_IF_ERROR(!buffer, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR((int)(offset+size) > buffer->getSize(), GL_INVALID_VALUE, RC_RET_VOID);

	deMemcpy(buffer->getData()+offset, data, (int)size);
}